

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O0

void __thiscall
cmFindPathCommand::cmFindPathCommand
          (cmFindPathCommand *this,string *findCommandName,cmExecutionStatus *status)

{
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  string *findCommandName_local;
  cmFindPathCommand *this_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)findCommandName;
  findCommandName_local = (string *)this;
  std::__cxx11::string::string((string *)&local_40,(string *)findCommandName);
  cmFindBase::cmFindBase(&this->super_cmFindBase,&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_cmFindBase)._vptr_cmFindBase = (_func_int **)&PTR__cmFindPathCommand_00f4bb88;
  std::__cxx11::string::operator=((string *)&(this->super_cmFindBase).EnvironmentPath,"INCLUDE");
  this->IncludeFileInPath = false;
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmFindBase).VariableDocumentation,"Path to a file.");
  (this->super_cmFindBase).VariableType = PATH;
  return;
}

Assistant:

cmFindPathCommand::cmFindPathCommand(std::string findCommandName,
                                     cmExecutionStatus& status)
  : cmFindBase(std::move(findCommandName), status)
{
  this->EnvironmentPath = "INCLUDE";
  this->IncludeFileInPath = false;
  this->VariableDocumentation = "Path to a file.";
  this->VariableType = cmStateEnums::PATH;
}